

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O0

void __thiscall
cppcms::impl::garbage_collector::garbage_collector
          (garbage_collector *this,shared_ptr<cppcms::sessions::session_storage_factory> *f,
          int seconds)

{
  undefined4 in_EDX;
  shared_ptr<cppcms::sessions::session_storage_factory> *in_RSI;
  io_service *in_RDI;
  shared_ptr<cppcms::sessions::session_storage_factory> *in_stack_ffffffffffffffb8;
  
  booster::aio::io_service::io_service(in_RDI);
  booster::aio::deadline_timer::deadline_timer((deadline_timer *)(in_RDI + 0x10),in_RDI);
  std::shared_ptr<cppcms::sessions::session_storage_factory>::shared_ptr
            (in_RSI,in_stack_ffffffffffffffb8);
  *(undefined4 *)(in_RDI + 0x48) = in_EDX;
  return;
}

Assistant:

garbage_collector(	booster::shared_ptr<cppcms::sessions::session_storage_factory> f,
				int seconds)
		:	timer_(srv_),
			io_(f),
			seconds_(seconds)
	{
	}